

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

Vector<int,_std::allocator<int>_> * __thiscall
NavierStokesBase::fetchBCArray
          (Vector<int,_std::allocator<int>_> *__return_storage_ptr__,NavierStokesBase *this,
          int State_Type,Box *bx,int scomp,int ncomp)

{
  undefined8 *puVar1;
  pointer piVar2;
  BCRec *pBVar3;
  long lVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined4 uVar7;
  int *bxlo;
  ulong uVar8;
  BCRec bcr;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,(long)(ncomp * 6),
             (allocator_type *)&local_48);
  local_48 = 0xfffffd66fffffd66;
  uStack_40 = 0xfffffd66fffffd66;
  local_38 = 0xfffffd66fffffd66;
  if (0 < ncomp) {
    uVar6 = 0;
    do {
      uVar8 = uVar6 * 0x18 & 0x3fffffff8;
      pBVar3 = amrex::StateDescriptor::getBC
                         ((this->super_AmrLevel).state.
                          super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          _M_impl.super__Vector_impl_data._M_start[State_Type].desc,
                          scomp + (int)uVar6);
      lVar4 = 0;
      do {
        uVar5 = 0;
        uVar7 = 0;
        if (*(int *)((long)(bx->smallend).vect + lVar4) <=
            *(int *)((long)(this->super_AmrLevel).geom.domain.smallend.vect + lVar4)) {
          uVar7 = *(undefined4 *)((long)pBVar3->bc + lVar4);
        }
        *(undefined4 *)((long)&local_48 + lVar4) = uVar7;
        if (*(int *)((long)(this->super_AmrLevel).geom.domain.bigend.vect + lVar4) <=
            *(int *)((long)(bx->bigend).vect + lVar4)) {
          uVar5 = *(undefined4 *)((long)pBVar3->bc + lVar4 + 0xc);
        }
        *(undefined4 *)((long)&uStack_40 + lVar4 + 4) = uVar5;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
      piVar2 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *(undefined8 *)((long)piVar2 + uVar8 + 0x10) = local_38;
      puVar1 = (undefined8 *)((long)piVar2 + uVar8);
      *puVar1 = local_48;
      puVar1[1] = uStack_40;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)ncomp);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int>
NavierStokesBase::fetchBCArray (int State_Type, const Box& bx, int scomp, int ncomp)
{
    Vector<int> bc(2*AMREX_SPACEDIM*ncomp);
    BCRec bcr;
    const StateDescriptor* stDesc;
    const Box& domain = geom.Domain();

    for (int n = 0; n < ncomp; n++)
    {
        stDesc=state[State_Type].descriptor();
        setBC(bx,domain,stDesc->getBC(scomp+n),bcr);

        const int* b_rec = bcr.vect();
        for (int m = 0; m < 2*AMREX_SPACEDIM; m++) {
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
        }
    }

    return bc;
}